

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadEqn.c
# Opt level: O3

void Io_ReadEqnStrCutAt(char *pStr,char *pStop,int fUniqueOnly,Vec_Ptr_t *vTokens)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  char *__s2;
  void **ppvVar3;
  ulong uVar4;
  
  vTokens->nSize = 0;
  __s2 = strtok(pStr,pStop);
  do {
    if (__s2 == (char *)0x0) {
      return;
    }
    uVar1 = vTokens->nSize;
    if (0 < (int)uVar1 && fUniqueOnly != 0) {
      ppvVar3 = vTokens->pArray;
      uVar4 = 0;
      do {
        iVar2 = strcmp((char *)ppvVar3[uVar4],__s2);
        if (iVar2 == 0) goto LAB_0088fde4;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    if (uVar1 == vTokens->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vTokens->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vTokens->pArray,0x80);
        }
        vTokens->pArray = ppvVar3;
        vTokens->nCap = 0x10;
      }
      else {
        __size = (ulong)(uVar1 * 2) * 8;
        if (vTokens->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(__size);
        }
        else {
          ppvVar3 = (void **)realloc(vTokens->pArray,__size);
        }
        vTokens->pArray = ppvVar3;
        vTokens->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar3 = vTokens->pArray;
    }
    iVar2 = vTokens->nSize;
    vTokens->nSize = iVar2 + 1;
    ppvVar3[iVar2] = __s2;
LAB_0088fde4:
    __s2 = strtok((char *)0x0,pStop);
  } while( true );
}

Assistant:

void Io_ReadEqnStrCutAt( char * pStr, char * pStop, int fUniqueOnly, Vec_Ptr_t * vTokens )
{
    char * pToken;
    Vec_PtrClear( vTokens );
    for ( pToken = strtok( pStr, pStop ); pToken; pToken = strtok( NULL, pStop ) )
        if ( !fUniqueOnly || Io_ReadEqnStrFind( vTokens, pToken ) == -1 )
            Vec_PtrPush( vTokens, pToken );
}